

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<long_double>(longdouble t,bool t_return_value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  type_info *ptVar3;
  type_info in_SIL;
  undefined7 in_register_00000039;
  element_type *peVar4;
  undefined8 *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar6;
  
  peVar4 = (element_type *)CONCAT71(in_register_00000039,t_return_value);
  puVar1 = (undefined8 *)operator_new(0x20);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_003d0db0;
  *(longdouble *)(puVar1 + 2) = t;
  puVar2 = (undefined8 *)operator_new(0x20);
  puVar5 = puVar1 + 2;
  puVar2[1] = &std::shared_ptr<long_double>::typeinfo;
  *puVar2 = &PTR__Data_Impl_003d0e40;
  puVar2[2] = puVar5;
  puVar2[3] = puVar1;
  (peVar4->m_type_info).m_type_info = (type_info *)0x0;
  ptVar3 = (type_info *)operator_new(0x50);
  *(undefined8 *)(ptVar3 + 8) = 0x100000001;
  *(undefined ***)ptVar3 = &PTR___Sp_counted_ptr_inplace_003d0570;
  *(undefined **)(ptVar3 + 0x10) = &long_double::typeinfo;
  *(undefined **)(ptVar3 + 0x18) = &long_double::typeinfo;
  *(undefined4 *)(ptVar3 + 0x20) = 0x10;
  *(undefined8 **)(ptVar3 + 0x28) = puVar2;
  *(undefined8 **)(ptVar3 + 0x30) = puVar5;
  *(undefined8 **)(ptVar3 + 0x38) = puVar5;
  *(undefined8 *)(ptVar3 + 0x40) = 0;
  ptVar3[0x48] = (type_info)0x0;
  ptVar3[0x49] = in_SIL;
  (peVar4->m_type_info).m_bare_type_info = ptVar3;
  (peVar4->m_type_info).m_type_info = ptVar3 + 0x10;
  sVar6.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&long_double::typeinfo;
  sVar6.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar6.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(T t, bool t_return_value) {
        auto p = std::make_shared<T>(std::move(t));
        auto ptr = p.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(p)), false, ptr, t_return_value);
      }